

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc *__s;
  stbi_uc *__s_00;
  char *pcVar14;
  byte *pbVar15;
  byte bVar16;
  int iVar17;
  undefined4 in_register_0000000c;
  ulong uVar18;
  uint uVar19;
  uint n;
  uint uVar20;
  uint uVar21;
  stbi__context *unaff_R15;
  long in_FS_OFFSET;
  bool bVar22;
  uint local_84;
  stbi__context *local_80;
  uint local_6c;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar7 = stbi__gif_header(s,g,comp,0);
    if (iVar7 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar7 = g->w;
    iVar8 = g->h;
    iVar9 = stbi__mad3sizes_valid(4,iVar7,iVar8,0);
    if (iVar9 == 0) {
      pcVar14 = "too large";
    }
    else {
      iVar8 = iVar8 * iVar7;
      unaff_R15 = (stbi__context *)(long)(iVar8 * 4);
      psVar13 = (stbi_uc *)malloc((size_t)unaff_R15);
      g->out = psVar13;
      __s = (stbi_uc *)malloc((size_t)unaff_R15);
      g->background = __s;
      local_80 = (stbi__context *)(long)iVar8;
      __s_00 = (stbi_uc *)malloc((size_t)local_80);
      g->history = __s_00;
      pcVar14 = "outofmem";
      if ((psVar13 != (stbi_uc *)0x0) && (__s_00 != (stbi_uc *)0x0 && __s != (stbi_uc *)0x0)) {
        memset(psVar13,0,(size_t)unaff_R15);
        memset(__s,0,(size_t)unaff_R15);
        memset(__s_00,0,(size_t)local_80);
        goto LAB_0011c2b7;
      }
    }
    *(char **)(in_FS_OFFSET + -0x20) = pcVar14;
    unaff_R15 = (stbi__context *)0x0;
  }
  else {
    uVar20 = (uint)g->eflags >> 2 & 7;
    uVar6 = g->h * g->w;
    uVar12 = 2;
    if (uVar20 != 3) {
      uVar12 = uVar20;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar12 = uVar20;
    }
    if (uVar12 == 3) {
      if (0 < (int)uVar6) {
        uVar18 = 0;
        do {
          if (g->history[uVar18] != '\0') {
            *(undefined4 *)(g->out + uVar18 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar18 * 4);
          }
          uVar18 = uVar18 + 1;
        } while (uVar6 != uVar18);
      }
    }
    else if ((uVar12 == 2) && (0 < (int)uVar6)) {
      uVar18 = 0;
      do {
        if (g->history[uVar18] != '\0') {
          *(undefined4 *)(g->out + uVar18 * 4) = *(undefined4 *)(g->background + uVar18 * 4);
        }
        uVar18 = uVar18 + 1;
      } while (uVar6 != uVar18);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
LAB_0011c2b7:
    memset(g->history,0,(long)g->h * (long)g->w);
    do {
      psVar13 = s->img_buffer;
      if (psVar13 < s->img_buffer_end) {
LAB_0011c318:
        s->img_buffer = psVar13 + 1;
        sVar3 = *psVar13;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar13 = s->img_buffer;
          goto LAB_0011c318;
        }
        sVar3 = '\0';
      }
      if (sVar3 == '!') {
        psVar13 = s->img_buffer;
        if (s->img_buffer_end <= psVar13) {
          if (s->read_from_callbacks == 0) goto LAB_0011ca56;
          stbi__refill_buffer(s);
          psVar13 = s->img_buffer;
        }
        s->img_buffer = psVar13 + 1;
        if (*psVar13 != 0xf9) goto LAB_0011ca56;
        pbVar15 = s->img_buffer;
        if (pbVar15 < s->img_buffer_end) {
LAB_0011c3f7:
          s->img_buffer = pbVar15 + 1;
          bVar5 = *pbVar15;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar15 = s->img_buffer;
            goto LAB_0011c3f7;
          }
          bVar5 = 0;
        }
        if (bVar5 == 4) {
          pbVar15 = s->img_buffer;
          if (pbVar15 < s->img_buffer_end) {
LAB_0011c436:
            s->img_buffer = pbVar15 + 1;
            uVar12 = (uint)*pbVar15;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar15 = s->img_buffer;
              goto LAB_0011c436;
            }
            uVar12 = 0;
          }
          g->eflags = uVar12;
          iVar7 = stbi__get16le(s);
          g->delay = iVar7 * 10;
          if (-1 < (long)g->transparent) {
            g->pal[g->transparent][3] = 0xff;
          }
          if ((g->eflags & 1) != 0) {
            pbVar15 = s->img_buffer;
            if (pbVar15 < s->img_buffer_end) {
LAB_0011c5d0:
              s->img_buffer = pbVar15 + 1;
              bVar5 = *pbVar15;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar15 = s->img_buffer;
                goto LAB_0011c5d0;
              }
              bVar5 = 0;
            }
            g->transparent = (uint)bVar5;
            g->pal[bVar5][3] = '\0';
            goto LAB_0011ca56;
          }
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011c493:
            s->img_buffer = s->img_buffer + 1;
          }
          else {
            iVar7 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
            if (0 < iVar7) goto LAB_0011c493;
            s->img_buffer = s->img_buffer_end;
            (*(s->io).skip)(s->io_user_data,1 - iVar7);
          }
          g->transparent = -1;
LAB_0011ca56:
          do {
            pbVar15 = s->img_buffer;
            if (pbVar15 < s->img_buffer_end) {
LAB_0011ca7c:
              s->img_buffer = pbVar15 + 1;
              bVar5 = *pbVar15;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar15 = s->img_buffer;
                goto LAB_0011ca7c;
              }
              bVar5 = 0;
            }
            if (bVar5 == 0) goto LAB_0011c56a;
            stbi__skip(s,(uint)bVar5);
          } while( true );
        }
        stbi__skip(s,(uint)bVar5);
LAB_0011c56a:
        bVar22 = true;
      }
      else if (sVar3 == ';') {
        bVar22 = false;
        unaff_R15 = s;
      }
      else {
        if (sVar3 == ',') {
          iVar7 = stbi__get16le(s);
          iVar8 = stbi__get16le(s);
          iVar9 = stbi__get16le(s);
          iVar10 = stbi__get16le(s);
          if ((iVar9 + iVar7 <= g->w) && (iVar10 + iVar8 <= g->h)) {
            iVar17 = g->w * 4;
            g->line_size = iVar17;
            g->start_x = iVar7 << 2;
            g->start_y = iVar8 * iVar17;
            g->max_x = (iVar9 + iVar7) * 4;
            iVar10 = iVar17 * (iVar10 + iVar8);
            g->max_y = iVar10;
            g->cur_x = iVar7 << 2;
            if (iVar9 != 0) {
              iVar10 = iVar8 * iVar17;
            }
            g->cur_y = iVar10;
            pbVar15 = s->img_buffer;
            if (pbVar15 < s->img_buffer_end) {
LAB_0011c52c:
              s->img_buffer = pbVar15 + 1;
              uVar12 = (uint)*pbVar15;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar15 = s->img_buffer;
                goto LAB_0011c52c;
              }
              uVar12 = 0;
            }
            g->lflags = uVar12;
            if ((uVar12 & 0x40) == 0) {
              g->step = g->line_size;
              g->parse = 0;
            }
            else {
              g->step = g->line_size << 3;
              g->parse = 3;
            }
            if ((char)(byte)uVar12 < '\0') {
              iVar7 = -1;
              if ((g->eflags & 1) != 0) {
                iVar7 = g->transparent;
              }
              stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)uVar12 & 7),iVar7);
              g->color_table = g->lpal[0];
            }
            else {
              if ((g->flags & 0x80) == 0) {
                pcVar14 = "missing color table";
                goto LAB_0011c4a6;
              }
              g->color_table = g->pal[0];
            }
            pbVar15 = s->img_buffer;
            if (pbVar15 < s->img_buffer_end) {
LAB_0011c654:
              s->img_buffer = pbVar15 + 1;
              bVar5 = *pbVar15;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar15 = s->img_buffer;
                goto LAB_0011c654;
              }
              bVar5 = 0;
            }
            if (bVar5 < 0xd) {
              uVar12 = 1 << (bVar5 & 0x1f);
              uVar18 = 0;
              do {
                g->codes[uVar18].prefix = -1;
                g->codes[uVar18].first = (stbi_uc)uVar18;
                g->codes[uVar18].suffix = (stbi_uc)uVar18;
                uVar18 = uVar18 + 1;
              } while (uVar12 != uVar18);
              uVar11 = (2 << (bVar5 & 0x1f)) - 1;
              local_84 = 0xffffffff;
              bVar22 = true;
              n = 0;
              iVar8 = 0;
              uVar20 = 0;
              uVar6 = uVar12 + 2;
              local_6c = uVar11;
              iVar7 = bVar5 + 1;
LAB_0011c6ed:
              do {
                iVar9 = iVar8 - iVar7;
                if (iVar7 <= iVar8) {
                  bVar16 = (byte)iVar7;
                  uVar21 = uVar20 & local_6c;
                  bVar2 = true;
                  if (uVar21 == uVar12) {
                    iVar7 = bVar5 + 1;
                    uVar21 = 0xffffffff;
                    local_6c = uVar11;
                    local_84 = uVar12 + 2;
                    bVar22 = false;
                  }
                  else {
                    if (uVar21 == uVar12 + 1) {
                      do {
                        stbi__skip(s,n);
                        pbVar15 = s->img_buffer;
                        if (pbVar15 < s->img_buffer_end) {
LAB_0011c7fd:
                          s->img_buffer = pbVar15 + 1;
                          bVar4 = *pbVar15;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar15 = s->img_buffer;
                            goto LAB_0011c7fd;
                          }
                          bVar4 = 0;
                        }
                        if (bVar4 == 0) goto LAB_0011c83b;
                        n = (uint)bVar4;
                      } while( true );
                    }
                    if ((int)uVar6 < (int)uVar21) {
                      *(char **)(in_FS_OFFSET + -0x20) = "illegal code in raster";
                    }
                    else if (bVar22) {
                      *(char **)(in_FS_OFFSET + -0x20) = "no clear code";
                      bVar22 = true;
                    }
                    else {
                      if ((int)local_84 < 0) {
                        if (uVar21 != uVar6) goto LAB_0011c930;
                        *(char **)(in_FS_OFFSET + -0x20) = "illegal code in raster";
                      }
                      else {
                        uVar19 = uVar6 + 1;
                        if ((int)uVar6 < 0x2000) {
                          g->codes[(int)uVar6].prefix = (stbi__int16)local_84;
                          sVar3 = g->codes[local_84].first;
                          g->codes[(int)uVar6].first = sVar3;
                          if (uVar21 != uVar19) {
                            sVar3 = g->codes[(int)uVar21].first;
                          }
                          g->codes[(int)uVar6].suffix = sVar3;
                          uVar6 = uVar19;
LAB_0011c930:
                          local_84 = uVar6;
                          stbi__out_gif_code(g,(stbi__uint16)uVar21);
                          bVar22 = (local_84 & local_6c) == 0;
                          iVar8 = iVar7 + 1;
                          if ((int)local_84 < 0x1000 && bVar22) {
                            iVar7 = iVar8;
                          }
                          if ((int)local_84 < 0x1000 && bVar22) {
                            local_6c = ~(-1 << ((byte)iVar8 & 0x1f));
                          }
                          bVar22 = false;
                          bVar2 = true;
                          goto LAB_0011c886;
                        }
                        *(char **)(in_FS_OFFSET + -0x20) = "too many codes";
                        uVar6 = uVar19;
                      }
                      bVar22 = false;
                    }
                    bVar2 = false;
                    local_80 = (stbi__context *)0x0;
                    uVar21 = local_84;
                    local_84 = uVar6;
                  }
                  goto LAB_0011c886;
                }
                if (n == 0) {
                  pbVar15 = s->img_buffer;
                  if (pbVar15 < s->img_buffer_end) {
LAB_0011c720:
                    s->img_buffer = pbVar15 + 1;
                    bVar16 = *pbVar15;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar15 = s->img_buffer;
                      goto LAB_0011c720;
                    }
                    bVar16 = 0;
                  }
                  if (bVar16 == 0) {
                    local_80 = (stbi__context *)g->out;
                    goto LAB_0011c98b;
                  }
                  n = (uint)bVar16;
                }
                pbVar15 = s->img_buffer;
                if (pbVar15 < s->img_buffer_end) {
LAB_0011c75e:
                  s->img_buffer = pbVar15 + 1;
                  uVar21 = (uint)*pbVar15;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar15 = s->img_buffer;
                    goto LAB_0011c75e;
                  }
                  uVar21 = 0;
                }
                bVar16 = (byte)iVar8;
                n = n - 1;
                iVar8 = iVar8 + 8;
                uVar20 = uVar20 | uVar21 << (bVar16 & 0x1f);
              } while( true );
            }
            local_80 = (stbi__context *)0x0;
LAB_0011c98b:
            if (local_80 == (stbi__context *)0x0) {
              bVar22 = false;
              unaff_R15 = (stbi__context *)0x0;
            }
            else {
              unaff_R15 = local_80;
              if (psVar1 == (stbi_uc *)0x0) {
                uVar12 = g->h * g->w;
                if ((int)uVar12 < 1 || g->bgindex < 1) {
                  bVar22 = false;
                }
                else {
                  uVar18 = 0;
                  do {
                    if (g->history[uVar18] == '\0') {
                      g->pal[g->bgindex][3] = 0xff;
                      *(stbi_uc (*) [4])(g->out + uVar18 * 4) = g->pal[g->bgindex];
                    }
                    uVar18 = uVar18 + 1;
                    bVar22 = false;
                  } while (uVar12 != uVar18);
                }
              }
              else {
                bVar22 = false;
              }
            }
            goto LAB_0011c56c;
          }
          *(char **)(in_FS_OFFSET + -0x20) = "bad Image Descriptor";
        }
        else {
          pcVar14 = "unknown code";
LAB_0011c4a6:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar14;
        }
        bVar22 = false;
        unaff_R15 = (stbi__context *)0x0;
      }
LAB_0011c56c:
    } while (bVar22);
  }
  return (stbi_uc *)unaff_R15;
LAB_0011c83b:
  local_80 = (stbi__context *)g->out;
  n = 0;
  bVar2 = false;
  uVar21 = local_84;
  local_84 = uVar6;
LAB_0011c886:
  iVar8 = iVar9;
  uVar20 = (int)uVar20 >> (bVar16 & 0x1f);
  uVar6 = local_84;
  local_84 = uVar21;
  if (!bVar2) goto LAB_0011c98b;
  goto LAB_0011c6ed;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}